

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O0

Aig_Obj_t *
Dar_BalanceBuildSuperTop
          (Aig_Man_t *p,Vec_Ptr_t *vSuper,Aig_Type_t Type,int fUpdateLevel,int nLutSize)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar3;
  int local_40;
  int nBaseSize;
  int nBaseSizeAll;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vSubset;
  int nLutSize_local;
  int fUpdateLevel_local;
  Aig_Type_t Type_local;
  Vec_Ptr_t *vSuper_local;
  Aig_Man_t *p_local;
  
  if (vSuper->nSize < 2) {
    __assert_fail("vSuper->nSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                  ,0x1cf,
                  "Aig_Obj_t *Dar_BalanceBuildSuperTop(Aig_Man_t *, Vec_Ptr_t *, Aig_Type_t, int, int)"
                 );
  }
  Vec_PtrSort(vSuper,Aig_NodeCompareLevelsDecrease);
  do {
    iVar1 = Vec_PtrSize(vSuper);
    if (iVar1 < 2) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,0);
      return pAVar3;
    }
    local_40 = 0;
    p_00 = Vec_PtrAlloc(nLutSize);
    nBaseSize = Vec_PtrSize(vSuper);
    while (nBaseSize = nBaseSize + -1, -1 < nBaseSize) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,nBaseSize);
      iVar1 = Aig_BaseSize(p,pAVar3,nLutSize);
      if ((nLutSize < local_40 + iVar1) && (iVar2 = Vec_PtrSize(p_00), 1 < iVar2)) break;
      local_40 = iVar1 + local_40;
      Vec_PtrPush(p_00,pAVar3);
    }
    iVar1 = Vec_PtrSize(vSuper);
    iVar2 = Vec_PtrSize(p_00);
    Vec_PtrShrink(vSuper,iVar1 - iVar2);
    pAVar3 = Dar_BalanceBuildSuper(p,p_00,Type,fUpdateLevel);
    Vec_PtrFree(p_00);
    Dar_BalancePushUniqueOrderByLevel(vSuper,pAVar3,(uint)(Type == AIG_OBJ_EXOR));
  } while( true );
}

Assistant:

Aig_Obj_t * Dar_BalanceBuildSuperTop( Aig_Man_t * p, Vec_Ptr_t * vSuper, Aig_Type_t Type, int fUpdateLevel, int nLutSize )
{
    Vec_Ptr_t * vSubset;
    Aig_Obj_t * pObj;
    int i, nBaseSizeAll, nBaseSize;
    assert( vSuper->nSize > 1 );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Aig_NodeCompareLevelsDecrease );
    // add one LUT at a time
    while ( Vec_PtrSize(vSuper) > 1 )
    {
        // isolate the group of nodes with nLutSize inputs
        nBaseSizeAll = 0;
        vSubset = Vec_PtrAlloc( nLutSize );
        Vec_PtrForEachEntryReverse( Aig_Obj_t *, vSuper, pObj, i )
        {
            nBaseSize = Aig_BaseSize( p, pObj, nLutSize );
            if ( nBaseSizeAll + nBaseSize > nLutSize && Vec_PtrSize(vSubset) > 1 )
                break;
            nBaseSizeAll += nBaseSize;
            Vec_PtrPush( vSubset, pObj );
        }
        // remove them from vSuper
        Vec_PtrShrink( vSuper, Vec_PtrSize(vSuper) - Vec_PtrSize(vSubset) );
        // create the new supergate
        pObj = Dar_BalanceBuildSuper( p, vSubset, Type, fUpdateLevel );
        Vec_PtrFree( vSubset );
        // add the new output
        Dar_BalancePushUniqueOrderByLevel( vSuper, pObj, Type == AIG_OBJ_EXOR );
    }
    return (Aig_Obj_t *)Vec_PtrEntry(vSuper, 0);
}